

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::ClosePopupsExceptModals(void)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  ImGui *this;
  
  uVar1 = (GImGui->OpenPopupStack).Size;
  uVar4 = (ulong)uVar1;
  lVar3 = uVar4 * 0x38 + -0x30;
  do {
    this = (ImGui *)(ulong)((int)uVar1 >> 0x1f & uVar1);
    if ((int)uVar4 < 1) break;
    this = (ImGui *)(uVar4 & 0xffffffff);
    lVar2 = *(long *)((long)&((GImGui->OpenPopupStack).Data)->PopupId + lVar3);
    if (lVar2 == 0) break;
    lVar3 = lVar3 + -0x38;
    uVar4 = uVar4 - 1;
  } while ((*(byte *)(lVar2 + 0x17) & 8) == 0);
  if ((int)uVar1 <= (int)this) {
    return;
  }
  ClosePopupToLevel(this,1,SUB81(lVar3,0));
  return;
}

Assistant:

void ImGui::ClosePopupsExceptModals()
{
    ImGuiContext& g = *GImGui;

    int popup_count_to_keep;
    for (popup_count_to_keep = g.OpenPopupStack.Size; popup_count_to_keep > 0; popup_count_to_keep--)
    {
        ImGuiWindow* window = g.OpenPopupStack[popup_count_to_keep - 1].Window;
        if (!window || (window->Flags & ImGuiWindowFlags_Modal))
            break;
    }
    if (popup_count_to_keep < g.OpenPopupStack.Size) // This test is not required but it allows to set a convenient breakpoint on the statement below
        ClosePopupToLevel(popup_count_to_keep, true);
}